

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O1

FT_Error cf2_decoder_parse_charstrings
                   (PS_Decoder *decoder,FT_Byte *charstring_base,FT_ULong charstring_len)

{
  CF2_BlueRec *pCVar1;
  char cVar2;
  char cVar3;
  FT_Bool FVar4;
  FT_Bool FVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  FT_Face pFVar10;
  FT_Driver pFVar11;
  CFF_GlyphSlot pCVar12;
  FT_Memory memory;
  PS_Decoder *pPVar13;
  CFF_SubFont pCVar14;
  FT_Pos FVar15;
  bool bVar16;
  FT_Service_CFFLoad darkenParams;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  FT_Bool FVar19;
  uint uVar20;
  int iVar21;
  CF2_Font font;
  FT_Long FVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  FT_Error FVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  FT_Bool FVar30;
  CF2_F16Dot16 CVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  FT_UFast lenNormalizedV;
  FT_Error error;
  CF2_F16Dot16 advWidth;
  FT_Fixed *normalizedV;
  CF2_Matrix transform;
  CF2_BufferRec buf;
  FT_Vector translation;
  FT_UFast local_ac;
  FT_Service_CFFLoad local_a8;
  FT_Error local_a0;
  CF2_F16Dot16 local_9c;
  CF2_BlueRec *local_98;
  FT_Fixed *local_90;
  undefined1 local_88 [5];
  char cStack_83;
  char cStack_82;
  char cStack_81;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_6c;
  undefined1 local_68 [16];
  FT_Byte *local_58;
  FT_Byte *pFStack_50;
  FT_Vector local_40;
  
  local_a0 = 0;
  FVar19 = (decoder->builder).is_t1;
  if ((FVar19 != '\0') && (decoder->current_subfont == (CFF_SubFont)0x0)) {
    return 8;
  }
  font = (CF2_Font)decoder->cf2_instance->data;
  if (font == (CF2_Font)0x0) {
    memory = (decoder->builder).memory;
    decoder->cf2_instance->finalizer = cf2_free_instance;
    font = (CF2_Font)ft_mem_alloc(memory,0x290,&local_a0);
    decoder->cf2_instance->data = font;
    if (local_a0 != 0) {
      return 0x40;
    }
    font->memory = memory;
    if (FVar19 == '\0') {
      font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;
    }
    (font->outline).root.windingMomentum = 0;
    *(undefined4 *)&(font->outline).root.field_0x24 = 0;
    (font->outline).root.memory = (FT_Memory)0x0;
    *(undefined1 (*) [16])&(font->outline).root.error = (undefined1  [16])0x0;
    (font->outline).root.moveTo = (CF2_Callback_Type)0x0;
    (font->outline).root.lineTo = (CF2_Callback_Type)0x0;
    (font->outline).root.quadTo = (CF2_Callback_Type)0x0;
    (font->outline).root.cubeTo = (CF2_Callback_Type)0x0;
    (font->outline).root.memory = memory;
    (font->outline).root.error = &font->error;
    (font->outline).root.moveTo = cf2_builder_moveTo;
    (font->outline).root.lineTo = cf2_builder_lineTo;
    (font->outline).root.cubeTo = cf2_builder_cubeTo;
  }
  font->decoder = decoder;
  (font->outline).decoder = decoder;
  pFVar10 = (decoder->builder).face;
  pFVar11 = pFVar10->driver;
  cVar2 = *(char *)((long)&pFVar11[1].root.clazz + 4);
  cVar3 = pFVar10->internal->no_stem_darkening;
  local_68._8_8_ = 0;
  local_68._0_8_ = charstring_base;
  local_68 = local_68 << 0x40;
  pFStack_50 = charstring_base;
  local_58 = charstring_base + charstring_len;
  local_78 = 0;
  pCVar12 = (decoder->builder).glyph;
  FVar4 = pCVar12->hint;
  stack0xffffffffffffff7c = SUB1612((undefined1  [16])0x0,4);
  if (FVar4 == '\0') {
    local_88._0_4_ = 0x400;
    iVar38 = 0x400;
  }
  else {
    iVar33 = (int)pCVar12->x_scale;
    iVar38 = iVar33 + 0x20;
    iVar33 = iVar33 + 0x5f;
    if (-1 < iVar38) {
      iVar33 = iVar38;
    }
    local_88._0_4_ = iVar33 >> 6;
    iVar38 = (int)pCVar12->y_scale;
    iVar33 = iVar38 + 0x20;
    iVar38 = iVar38 + 0x5f;
    if (-1 < iVar33) {
      iVar38 = iVar33;
    }
    iVar38 = iVar38 >> 6;
  }
  FVar5 = pCVar12->scaled;
  uStack_80._4_4_ = iVar38;
  auVar18 = _local_88;
  if (FVar19 == '\0') {
    FVar30 = *(FT_Bool *)&pFVar10[4].glyph;
  }
  else {
    FVar30 = '\0';
  }
  font->isCFF2 = FVar30;
  font->isT1 = FVar19;
  uVar39 = (uint)(FVar4 != '\0');
  font->renderingFlags = uVar39;
  if ((FVar5 != '\0') && ((cVar3 == '\0' || ((cVar3 < '\0' && (cVar2 == '\0')))))) {
    font->renderingFlags = uVar39 | 2;
  }
  font->darkenParams[0] = *(FT_Int *)&pFVar11[1].root.library;
  font->darkenParams[1] = *(FT_Int *)((long)&pFVar11[1].root.library + 4);
  font->darkenParams[2] = *(FT_Int *)&pFVar11[1].root.memory;
  font->darkenParams[3] = *(FT_Int *)((long)&pFVar11[1].root.memory + 4);
  font->darkenParams[4] = *(FT_Int *)&pFVar11[1].clazz;
  font->darkenParams[5] = *(FT_Int *)((long)&pFVar11[1].clazz + 4);
  font->darkenParams[6] = *(FT_Int *)&pFVar11[1].faces_list.head;
  font->darkenParams[7] = *(FT_Int *)((long)&pFVar11[1].faces_list.head + 4);
  uVar9 = ((decoder->builder).face)->units_per_EM;
  font->unitsPerEm = (uint)uVar9;
  if (FVar5 != '\0') {
    uVar17 = local_88._0_4_;
    iVar33 = 0x24;
    bVar40 = 0 < (int)local_88._0_4_;
    _local_88 = auVar18;
    if (((bVar40) && (0 < iVar38)) && (iVar33 = 0xa4, -1 < (short)uVar9)) {
      FVar22 = FT_DivFix(0x7d00000,(ulong)uVar9 << 0x10);
      if (((int)uVar17 <= (int)FVar22) && (iVar33 = 0xa4, iVar38 <= (int)FVar22)) {
        iVar33 = 0;
      }
    }
    if (iVar33 != 0) {
      return iVar33;
    }
  }
  local_9c = 0;
  local_40.x = (FT_Pos)(int)local_78;
  local_40.y = (FT_Pos)local_78._4_4_;
  pPVar13 = font->decoder;
  uVar39 = font->syntheticEmboldeningAmountX;
  uVar23 = (ulong)uVar39;
  CVar31 = font->syntheticEmboldeningAmountY;
  local_ac = 0;
  local_90 = (FT_Fixed *)0x0;
  font->error = 0;
  pCVar14 = pPVar13->current_subfont;
  bVar40 = font->lastSubfont != pCVar14;
  if (bVar40) {
    font->lastSubfont = pCVar14;
  }
  if (font->isT1 == '\0') {
    bVar16 = true;
    if ((pPVar13->cff->vstore).dataCount != 0) {
      local_a8 = font->cffload;
      pFVar10 = (pPVar13->builder).face;
      iVar38 = (*(code *)((pFVar10[3].glyph)->metrics).horiBearingX)(pFVar10,&local_ac,0,&local_90);
      font->error = iVar38;
      if (iVar38 == 0) {
        FVar19 = (*local_a8->blend_check_vector)
                           (&pCVar14->blend,(pCVar14->private_dict).vsindex,local_ac,local_90);
        if (FVar19 != '\0') {
          (*local_a8->load_private_dict)(pPVar13->cff,pCVar14,local_ac,local_90);
        }
        bVar40 = FVar19 != '\0' || bVar40;
        (font->blend).font = (pCVar14->blend).font;
        (font->blend).usedBV = '\0';
        font->vsindex = (pCVar14->private_dict).vsindex;
        font->lenNDV = local_ac;
        font->NDV = local_90;
      }
      else {
        bVar16 = false;
      }
    }
    if (!bVar16) goto LAB_0014e325;
  }
  auVar18 = _local_88;
  iVar38 = (uint)(((pPVar13->builder).face)->size->metrics).y_ppem << 0x10;
  if (font->ppem != iVar38) {
    font->ppem = iVar38;
    bVar40 = true;
  }
  uVar20 = font->renderingFlags;
  font->hinted = (byte)uVar20 & 1;
  auVar41[0] = -((char)(font->currentTransform).a == local_88[0]);
  auVar41[1] = -(*(char *)((long)&(font->currentTransform).a + 1) == local_88[1]);
  auVar41[2] = -(*(char *)((long)&(font->currentTransform).a + 2) == local_88[2]);
  auVar41[3] = -(*(char *)((long)&(font->currentTransform).a + 3) == local_88[3]);
  auVar41[4] = -((char)(font->currentTransform).b == local_88[4]);
  auVar41[5] = -(*(char *)((long)&(font->currentTransform).b + 1) == cStack_83);
  auVar41[6] = -(*(char *)((long)&(font->currentTransform).b + 2) == cStack_82);
  auVar41[7] = -(*(char *)((long)&(font->currentTransform).b + 3) == cStack_81);
  auVar41[8] = -((char)(font->currentTransform).c == (char)uStack_80);
  auVar41[9] = -(*(char *)((long)&(font->currentTransform).c + 1) == uStack_80._1_1_);
  auVar41[10] = -(*(char *)((long)&(font->currentTransform).c + 2) == uStack_80._2_1_);
  auVar41[0xb] = -(*(char *)((long)&(font->currentTransform).c + 3) == uStack_80._3_1_);
  auVar41[0xc] = -((char)(font->currentTransform).d == uStack_80._4_1_);
  auVar41[0xd] = -(*(char *)((long)&(font->currentTransform).d + 1) == uStack_80._5_1_);
  auVar41[0xe] = -(*(char *)((long)&(font->currentTransform).d + 2) == uStack_80._6_1_);
  auVar41[0xf] = -(*(char *)((long)&(font->currentTransform).d + 3) == uStack_80._7_1_);
  if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe | (ushort)(auVar41[0xf] >> 7) << 0xf)
      != 0xffff) {
    (font->currentTransform).tx = (int)local_78;
    (font->currentTransform).ty = local_78._4_4_;
    (font->currentTransform).a = local_88._0_4_;
    (font->currentTransform).b = stack0xffffffffffffff7c;
    (font->currentTransform).c = (undefined4)uStack_80;
    (font->currentTransform).d = uStack_80._4_4_;
    (font->currentTransform).tx = 0;
    (font->currentTransform).ty = 0;
    (font->innerTransform).a = local_88._0_4_;
    (font->innerTransform).b = stack0xffffffffffffff7c;
    (font->innerTransform).c = (undefined4)uStack_80;
    (font->innerTransform).d = uStack_80._4_4_;
    (font->innerTransform).tx = (int)local_78;
    (font->innerTransform).ty = local_78._4_4_;
    (font->outerTransform).a = 0x10000;
    (font->outerTransform).b = 0;
    (font->outerTransform).c = 0;
    (font->outerTransform).d = 0x10000;
    bVar40 = true;
  }
  uVar20 = uVar20 & 2;
  if (uVar20 != font->stemDarkened) {
    font->stemDarkened = (FT_Bool)uVar20;
    bVar40 = true;
  }
  _local_88 = auVar18;
  if (!bVar40) goto LAB_0014e325;
  iVar38 = 1000;
  if (font->unitsPerEm != 0) {
    iVar38 = font->unitsPerEm;
  }
  uVar20 = 0x40000;
  if (0x40000 < font->ppem) {
    uVar20 = font->ppem;
  }
  iVar33 = (int)(pPVar13->current_subfont->private_dict).standard_height;
  font->stdVW = iVar33 << 0x10;
  iVar35 = (int)(0x3e80000 / (long)iVar38);
  lVar24 = (long)iVar35;
  local_98 = (CF2_BlueRec *)CONCAT44(local_98._4_4_,CVar31);
  if (iVar33 << 0x10 < 1) {
    FVar22 = FT_DivFix(0x4b0000,lVar24);
    font->stdVW = (CF2_F16Dot16)FVar22;
    CVar31 = (CF2_F16Dot16)local_98;
  }
  local_a8 = (FT_Service_CFFLoad)font->darkenParams;
  if ((int)uVar39 < 1) {
    cf2_computeDarkening
              (iVar35,uVar20,font->stdVW,&font->darkenX,0,font->stemDarkened,(FT_Int *)local_a8);
  }
  else {
    local_6c = iVar35;
    FVar22 = FT_DivFix((long)(iVar38 << 0x10),(ulong)uVar20);
    if ((long)uVar23 <= FVar22) {
      uVar23 = FT_DivFix((long)(iVar38 << 0x10),(ulong)uVar20);
    }
    font->darkenX = 0;
    CVar31 = (CF2_F16Dot16)local_98;
    iVar35 = local_6c;
    if ((0x28e < local_6c) && ((int)uVar23 != 0)) {
      font->darkenX = (int)(((uint)(uVar23 >> 0x1f) & 1) + (int)uVar23) >> 1;
    }
  }
  FVar15 = (pPVar13->current_subfont->private_dict).standard_width;
  if ((short)FVar15 < 1) {
LAB_0014ddee:
    FVar22 = 0x6e0000;
  }
  else {
    iVar33 = (int)FVar15;
    iVar21 = iVar33 * 0x20000;
    FVar22 = 0x4b0000;
    iVar38 = font->stdVW;
    if (iVar38 == iVar21 || SBORROW4(iVar38,iVar21) != iVar38 + iVar33 * -0x20000 < 0)
    goto LAB_0014ddee;
  }
  FVar22 = FT_DivFix(FVar22,lVar24);
  darkenParams = local_a8;
  font->stdHW = (CF2_F16Dot16)FVar22;
  local_a8 = (FT_Service_CFFLoad)&font->darkenY;
  cf2_computeDarkening
            (iVar35,uVar20,(CF2_F16Dot16)FVar22,(CF2_F16Dot16 *)local_a8,CVar31,font->stemDarkened,
             (FT_Int *)darkenParams);
  bVar40 = true;
  if (font->darkenX == 0) {
    bVar40 = *(int *)&local_a8->get_standard_encoding != 0;
  }
  font->darkened = bVar40;
  font->reverseWinding = '\0';
  pPVar13 = font->decoder;
  uVar39 = 0;
  memset(&font->blues,0,0x150);
  (font->blues).scale = (font->innerTransform).d;
  FVar22 = FT_DivFix((pPVar13->current_subfont->private_dict).blue_scale,0x3e80000);
  (font->blues).blueScale = (CF2_F16Dot16)FVar22;
  pCVar14 = pPVar13->current_subfont;
  (font->blues).blueShift = (int)(pCVar14->private_dict).blue_shift << 0x10;
  (font->blues).blueFuzz = (int)(pCVar14->private_dict).blue_fuzz << 0x10;
  bVar6 = (pCVar14->private_dict).num_blue_values;
  uVar27 = (ulong)bVar6;
  uVar23 = (ulong)(pCVar14->private_dict).num_other_blues;
  bVar7 = (pCVar14->private_dict).num_family_blues;
  bVar8 = (pCVar14->private_dict).num_family_other_blues;
  if ((pCVar14->private_dict).language_group == 1) {
    if (uVar27 != 0) {
      if (bVar6 != 4) goto LAB_0014dffb;
      if ((((-0x79 < (short)(pCVar14->private_dict).blue_values[0]) ||
           (-0x79 < (short)(pCVar14->private_dict).blue_values[1])) ||
          ((short)(pCVar14->private_dict).blue_values[2] < 0x371)) ||
         ((short)(pCVar14->private_dict).blue_values[3] < 0x371)) goto LAB_0014dff2;
    }
    (font->blues).emBoxBottomEdge.csCoord = -0x780001;
    iVar38 = (font->blues).scale;
    lVar24 = (long)iVar38 * -0x780001;
    (font->blues).emBoxBottomEdge.dsCoord =
         ((int)((ulong)(lVar24 + 0x8000 + (lVar24 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000) -
         0x8000;
    (font->blues).emBoxBottomEdge.scale = iVar38;
    (font->blues).emBoxBottomEdge.flags = 0x31;
    lVar24 = (long)font->darkenY * 2 + 0x3700001;
    (font->blues).emBoxTopEdge.csCoord = (CF2_F16Dot16)lVar24;
    lVar24 = lVar24 * iVar38;
    (font->blues).emBoxTopEdge.dsCoord =
         (int)((ulong)(lVar24 + 0x8000 + (lVar24 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000 | 0x8000;
    (font->blues).emBoxTopEdge.scale = iVar38;
    (font->blues).emBoxTopEdge.flags = 0x32;
    (font->blues).doEmBoxHints = '\x01';
  }
  else {
LAB_0014dff2:
    if (uVar27 != 0) {
LAB_0014dffb:
      uVar32 = (ulong)(font->blues).count;
      uVar39 = 0;
      uVar28 = 0;
      uVar20 = uVar39;
      do {
        iVar38 = (int)(pCVar14->private_dict).blue_values[uVar28];
        iVar33 = iVar38 * 0x10000;
        (font->blues).zone[uVar32].csBottomEdge = iVar33;
        CVar31 = (int)(pCVar14->private_dict).blue_values[uVar28 + 1] * 0x10000;
        (font->blues).zone[uVar32].csTopEdge = CVar31;
        uVar36 = CVar31 + iVar38 * -0x10000;
        if (-1 < (int)uVar36) {
          pCVar1 = (font->blues).zone + uVar32;
          bVar40 = (int)uVar39 < (int)uVar36;
          uVar39 = uVar20;
          if (bVar40) {
            uVar39 = uVar36;
          }
          if (uVar28 != 0) {
            iVar38 = *(int *)&local_a8->get_standard_encoding;
            (font->blues).zone[uVar32].csTopEdge = CVar31 + iVar38 * 2;
            CVar31 = iVar33 + iVar38 * 2;
            pCVar1->csBottomEdge = CVar31;
          }
          (font->blues).zone[uVar32].bottomZone = uVar28 == 0;
          pCVar1->csFlatEdge = CVar31;
          uVar20 = (int)uVar32 + 1;
          uVar32 = (ulong)uVar20;
          (font->blues).count = uVar20;
          uVar20 = uVar39;
        }
        uVar28 = uVar28 + 2;
      } while (uVar28 < uVar27);
    }
    if (uVar23 != 0) {
      uVar20 = (font->blues).count;
      uVar27 = 0;
      do {
        iVar38 = (int)(pCVar14->private_dict).other_blues[uVar27];
        (font->blues).zone[uVar20].csBottomEdge = iVar38 * 0x10000;
        iVar33 = (int)(pCVar14->private_dict).other_blues[uVar27 + 1] * 0x10000;
        (font->blues).zone[uVar20].csTopEdge = iVar33;
        uVar36 = iVar33 + iVar38 * -0x10000;
        if (-1 < (int)uVar36) {
          if ((int)uVar39 < (int)uVar36) {
            uVar39 = uVar36;
          }
          (font->blues).zone[uVar20].bottomZone = '\x01';
          (font->blues).zone[uVar20].csFlatEdge = iVar33;
          uVar20 = uVar20 + 1;
          (font->blues).count = uVar20;
        }
        uVar27 = uVar27 + 2;
      } while (uVar27 < uVar23);
    }
    FVar22 = FT_DivFix(0x10000,(long)(font->blues).scale);
    uVar23 = (ulong)(font->blues).count;
    if (uVar23 != 0) {
      local_98 = (font->blues).zone;
      uVar27 = 0;
      do {
        iVar38 = local_98[uVar27].csFlatEdge;
        iVar33 = (int)FVar22;
        if (local_98[uVar27].bottomZone == '\0') {
          if (2 < bVar7) {
            iVar35 = *(int *)&local_a8->get_standard_encoding;
            iVar21 = 0x7fffffff;
            lVar24 = 0x44;
            do {
              iVar37 = (&(pCVar14->font_dict).version)[lVar24 * 2] * 0x10000 + iVar35 * 2;
              iVar34 = iVar38 - iVar37;
              iVar25 = -iVar34;
              if (0 < iVar34) {
                iVar25 = iVar34;
              }
            } while ((((iVar21 <= iVar25) || (iVar33 <= iVar25)) ||
                     (local_98[uVar27].csFlatEdge = iVar37, iVar21 = iVar25, iVar38 != iVar37)) &&
                    (uVar32 = lVar24 - 0x40, lVar24 = lVar24 + 2, uVar32 < bVar7));
          }
        }
        else {
          iVar35 = 0x7fffffff;
          if (bVar8 != 0) {
            uVar32 = 0;
            do {
              iVar21 = (int)(pCVar14->private_dict).family_other_blues[uVar32 + 1];
              iVar34 = iVar21 * 0x10000;
              iVar25 = iVar38 + iVar21 * -0x10000;
              iVar21 = -iVar25;
              if (0 < iVar25) {
                iVar21 = iVar25;
              }
              if (((iVar21 < iVar35) && (iVar21 < iVar33)) &&
                 (local_98[uVar27].csFlatEdge = iVar34, iVar35 = iVar21, iVar38 == iVar34)) {
                iVar35 = 0;
                break;
              }
              uVar32 = uVar32 + 2;
            } while (uVar32 < bVar8);
          }
          if (1 < bVar7) {
            iVar21 = (int)(pCVar14->private_dict).family_blues[1];
            iVar38 = iVar38 + iVar21 * -0x10000;
            iVar25 = -iVar38;
            if (0 < iVar38) {
              iVar25 = iVar38;
            }
            if ((iVar25 < iVar35) && (iVar25 < iVar33)) {
              local_98[uVar27].csFlatEdge = iVar21 * 0x10000;
            }
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar23);
    }
    if (0 < (int)uVar39) {
      iVar38 = (font->blues).blueScale;
      FVar22 = FT_DivFix(0x10000,(ulong)uVar39);
      if (FVar22 < iVar38) {
        FVar22 = FT_DivFix(0x10000,(ulong)uVar39);
        (font->blues).blueScale = (CF2_F16Dot16)FVar22;
      }
    }
    iVar38 = (font->blues).scale;
    iVar33 = (font->blues).blueScale;
    if (iVar38 < iVar33) {
      (font->blues).suppressOvershoot = '\x01';
      FVar22 = FT_MulDiv(0x999a,(long)iVar38,(long)iVar33);
      iVar38 = 0x999a - (int)FVar22;
      if (0x7ffe < iVar38) {
        iVar38 = 0x7fff;
      }
      (font->blues).boost = iVar38;
    }
    if (font->stemDarkened != '\0') {
      (font->blues).boost = 0;
    }
    uVar23 = (ulong)(font->blues).count;
    if (uVar23 != 0) {
      iVar38 = (font->blues).scale;
      iVar33 = (font->blues).boost;
      lVar24 = 0;
      do {
        lVar29 = (long)*(int *)((long)&(font->blues).zone[0].csFlatEdge + lVar24) * (long)iVar38;
        iVar35 = (int)((ulong)(lVar29 + (lVar29 >> 0x3f) + 0x8000) >> 0x10);
        uVar39 = (iVar35 - iVar33) + 0x8000;
        if ((&(font->blues).zone[0].bottomZone)[lVar24] == '\0') {
          uVar39 = iVar33 + 0x8000 + iVar35;
        }
        *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar24) = uVar39 & 0xffff0000;
        lVar24 = lVar24 + 0x14;
      } while (uVar23 * 0x14 != lVar24);
    }
  }
LAB_0014e325:
  if (font->error == 0) {
    font->reverseWinding = '\0';
    bVar40 = font->darkened == '\0';
    while( true ) {
      pPVar13 = (font->outline).decoder;
      (font->outline).root.windingMomentum = 0;
      FT_GlyphLoader_Rewind((pPVar13->builder).loader);
      cf2_interpT2CharString
                (font,(CF2_Buffer)local_68,&(font->outline).root,&local_40,'\0',0,0,&local_9c);
      if (font->error != 0) break;
      if ((bVar40) || (-1 < (font->outline).root.windingMomentum)) {
        pPVar13 = (font->outline).decoder;
        ps_builder_close_contour(&pPVar13->builder);
        FT_GlyphLoader_Add((pPVar13->builder).loader);
        break;
      }
      font->reverseWinding = '\x01';
      bVar40 = true;
    }
  }
  if (font->error == 0) {
    font->error = 0;
  }
  FVar26 = 3;
  if (font->error == 0) {
    pPVar13 = (font->outline).decoder;
    FVar26 = 0;
    if ((pPVar13->builder).is_t1 == '\0') {
      *pPVar13->glyph_width = (long)(short)((uint)(local_9c + 0x8000) >> 0x10);
      FVar26 = 0;
    }
  }
  return FVar26;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_decoder_parse_charstrings( PS_Decoder*  decoder,
                                 FT_Byte*     charstring_base,
                                 FT_ULong     charstring_len )
  {
    FT_Memory  memory;
    FT_Error   error = FT_Err_Ok;
    CF2_Font   font;

    FT_Bool    is_t1 = decoder->builder.is_t1;


    FT_ASSERT( decoder &&
               ( is_t1 || decoder->cff ) );

    if ( is_t1 && !decoder->current_subfont )
    {
      FT_ERROR(( "cf2_decoder_parse_charstrings (Type 1): "
                 "SubFont missing. Use `t1_make_subfont' first\n" ));
      return FT_THROW( Invalid_Table );
    }

    memory = decoder->builder.memory;

    /* CF2 data is saved here across glyphs */
    font = (CF2_Font)decoder->cf2_instance->data;

    /* on first glyph, allocate instance structure */
    if ( !decoder->cf2_instance->data )
    {
      decoder->cf2_instance->finalizer =
        (FT_Generic_Finalizer)cf2_free_instance;

      if ( FT_ALLOC( decoder->cf2_instance->data,
                     sizeof ( CF2_FontRec ) ) )
        return FT_THROW( Out_Of_Memory );

      font = (CF2_Font)decoder->cf2_instance->data;

      font->memory = memory;

      if ( !is_t1 )
        font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;

      /* initialize a client outline, to be shared by each glyph rendered */
      cf2_outline_init( &font->outline, font->memory, &font->error );
    }

    /* save decoder; it is a stack variable and will be different on each */
    /* call                                                               */
    font->decoder         = decoder;
    font->outline.decoder = decoder;

    {
      /* build parameters for Adobe engine */

      PS_Builder*  builder = &decoder->builder;
      PS_Driver    driver  = (PS_Driver)FT_FACE_DRIVER( builder->face );

      FT_Bool  no_stem_darkening_driver =
                 driver->no_stem_darkening;
      FT_Char  no_stem_darkening_font =
                 builder->face->internal->no_stem_darkening;

      /* local error */
      FT_Error       error2 = FT_Err_Ok;
      CF2_BufferRec  buf;
      CF2_Matrix     transform;
      CF2_F16Dot16   glyphWidth;

      FT_Bool  hinted;
      FT_Bool  scaled;


      /* FreeType has already looked up the GID; convert to         */
      /* `RegionBuffer', assuming that the input has been validated */
      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( &buf );
      buf.start =
      buf.ptr   = charstring_base;
      buf.end   = charstring_base + charstring_len;

      FT_ZERO( &transform );

      cf2_getScaleAndHintFlag( decoder,
                               &transform.a,
                               &transform.d,
                               &hinted,
                               &scaled );

      if ( is_t1 )
        font->isCFF2 = FALSE;
      else
      {
        /* copy isCFF2 boolean from TT_Face to CF2_Font */
        font->isCFF2 = ((TT_Face)builder->face)->is_cff2;
      }
      font->isT1 = is_t1;

      font->renderingFlags = 0;
      if ( hinted )
        font->renderingFlags |= CF2_FlagsHinted;
      if ( scaled && ( !no_stem_darkening_font        ||
                       ( no_stem_darkening_font < 0 &&
                         !no_stem_darkening_driver  ) ) )
        font->renderingFlags |= CF2_FlagsDarkened;

      font->darkenParams[0] = driver->darken_params[0];
      font->darkenParams[1] = driver->darken_params[1];
      font->darkenParams[2] = driver->darken_params[2];
      font->darkenParams[3] = driver->darken_params[3];
      font->darkenParams[4] = driver->darken_params[4];
      font->darkenParams[5] = driver->darken_params[5];
      font->darkenParams[6] = driver->darken_params[6];
      font->darkenParams[7] = driver->darken_params[7];

      /* now get an outline for this glyph;      */
      /* also get units per em to validate scale */
      font->unitsPerEm = (CF2_Int)cf2_getUnitsPerEm( decoder );

      if ( scaled )
      {
        error2 = cf2_checkTransform( &transform, font->unitsPerEm );
        if ( error2 )
          return error2;
      }

      error2 = cf2_getGlyphOutline( font, &buf, &transform, &glyphWidth );
      if ( error2 )
        return FT_ERR( Invalid_File_Format );

      cf2_setGlyphWidth( &font->outline, glyphWidth );

      return FT_Err_Ok;
    }
  }